

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxBasisBase(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,TYPE ttype)

{
  Timer *pTVar1;
  
  this->_vptr_SPxBasisBase = (_func_int **)&PTR_change_00336230;
  this->theLP = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0;
  DataArray<soplex::SPxId>::DataArray(&this->theBaseId,0,0,1.2);
  DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
  ::DataArray(&this->matrix,0,0,1.2);
  this->matrixIsSetup = false;
  this->factor = (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0;
  this->factorized = false;
  this->maxUpdates = 200;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&(this->nonzeroFactor).m_backend,10.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&(this->fillFactor).m_backend,5.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&(this->memFactor).m_backend,1.5,(type *)0x0);
  this->iterCount = 0;
  this->lastIterCount = 0;
  this->iterDegenCheck = 0;
  this->updateCount = 0;
  this->totalUpdateCount = 0;
  this->nzCount = 1;
  this->lastMem = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&(this->lastFill).m_backend,0,(type *)0x0);
  this->lastNzCount = 0;
  this->theTime = (Timer *)0x0;
  this->timerType = ttype;
  (this->lastin).super_DataKey = (DataKey)0xffffffff00000000;
  (this->lastout).super_DataKey = (DataKey)0xffffffff00000000;
  this->lastidx = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&(this->minStab).m_backend,0.0,(type *)0x0);
  this->thestatus = NO_PROBLEM;
  Desc::Desc(&this->thedesc);
  this->freeSlinSolver = false;
  this->spxout = (SPxOut *)0x0;
  pTVar1 = TimerFactory::createTimer(this->timerType);
  this->theTime = pTVar1;
  return;
}

Assistant:

SPxBasisBase<R>::SPxBasisBase(Timer::TYPE ttype)
   : theLP(nullptr)
   , matrixIsSetup(false)
   , factor(nullptr)
   , factorized(false)
   , maxUpdates(200)
   , nonzeroFactor(10.0)
   , fillFactor(5.0)
   , memFactor(1.5)
   , iterCount(0)
   , lastIterCount(0)
   , iterDegenCheck(0)
   , updateCount(0)
   , totalUpdateCount(0)
   , nzCount(1)
   , lastMem(0)
   , lastFill(0)
   , lastNzCount(0)
   , theTime(nullptr)
   , timerType(ttype)
   , lastidx(0)
   , minStab(0.0)
   , thestatus(NO_PROBLEM)
   , freeSlinSolver(false)
   , spxout(nullptr)
{
   // info: is not consistent at this moment, e.g. because theLP == 0

   theTime = TimerFactory::createTimer(timerType);
}